

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<8,_1,_false,_embree::avx::SubGridIntersector1Moeller<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  RTCFilterFunctionN p_Var8;
  RTCIntersectArguments *pRVar9;
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined4 uVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  int iVar96;
  ulong uVar97;
  long lVar98;
  ulong uVar99;
  long lVar100;
  ulong uVar101;
  uint uVar102;
  ulong uVar103;
  long lVar104;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  ulong uVar108;
  ulong uVar109;
  long lVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  float fVar114;
  float fVar118;
  float fVar119;
  undefined1 auVar115 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [16];
  undefined1 auVar132 [32];
  undefined1 auVar131 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar175;
  float fVar181;
  float fVar183;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  uint uVar182;
  uint uVar184;
  float fVar185;
  uint uVar186;
  undefined1 auVar178 [16];
  float fVar187;
  uint uVar188;
  float fVar189;
  uint uVar190;
  float fVar191;
  uint uVar192;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  uint uVar193;
  float fVar194;
  float fVar197;
  float fVar198;
  undefined1 auVar195 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar196 [32];
  float fVar203;
  undefined1 auVar204 [32];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar205 [64];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1664;
  Geometry *local_1660;
  ulong local_1658;
  ulong local_1650;
  ulong local_1648;
  ulong local_1640;
  ulong local_1638;
  ulong local_1630;
  ulong *local_1628;
  ulong local_1620;
  ulong local_1618;
  ulong local_1610;
  ulong local_1608;
  ulong local_1600;
  ulong local_15f8;
  long local_15f0;
  long local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  long local_15d0;
  long local_15c8;
  float local_15c0;
  float local_15bc;
  float local_15b8;
  float local_15b4;
  float local_15b0;
  uint local_15ac;
  uint local_15a8;
  uint local_15a4;
  uint local_15a0;
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined1 local_1480 [32];
  undefined1 local_1460 [8];
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  uint uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  uint uStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar114 = ray->tfar;
    if (0.0 <= fVar114) {
      local_1628 = local_11f8;
      aVar3 = (ray->dir).field_0;
      auVar115 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar147._8_4_ = 0x7fffffff;
      auVar147._0_8_ = 0x7fffffff7fffffff;
      auVar147._12_4_ = 0x7fffffff;
      auVar147 = vandps_avx((undefined1  [16])aVar3,auVar147);
      auVar153._8_4_ = 0x219392ef;
      auVar153._0_8_ = 0x219392ef219392ef;
      auVar153._12_4_ = 0x219392ef;
      auVar147 = vcmpps_avx(auVar147,auVar153,1);
      auVar147 = vblendvps_avx((undefined1  [16])aVar3,auVar153,auVar147);
      auVar153 = vrcpps_avx(auVar147);
      fVar119 = auVar153._0_4_;
      auVar137._0_4_ = fVar119 * auVar147._0_4_;
      fVar120 = auVar153._4_4_;
      auVar137._4_4_ = fVar120 * auVar147._4_4_;
      fVar121 = auVar153._8_4_;
      auVar137._8_4_ = fVar121 * auVar147._8_4_;
      fVar123 = auVar153._12_4_;
      auVar137._12_4_ = fVar123 * auVar147._12_4_;
      auVar154._8_4_ = 0x3f800000;
      auVar154._0_8_ = 0x3f8000003f800000;
      auVar154._12_4_ = 0x3f800000;
      auVar147 = vsubps_avx(auVar154,auVar137);
      auVar138._0_4_ = fVar119 + fVar119 * auVar147._0_4_;
      auVar138._4_4_ = fVar120 + fVar120 * auVar147._4_4_;
      auVar138._8_4_ = fVar121 + fVar121 * auVar147._8_4_;
      auVar138._12_4_ = fVar123 + fVar123 * auVar147._12_4_;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      local_13a0._4_4_ = uVar1;
      local_13a0._0_4_ = uVar1;
      local_13a0._8_4_ = uVar1;
      local_13a0._12_4_ = uVar1;
      local_13a0._16_4_ = uVar1;
      local_13a0._20_4_ = uVar1;
      local_13a0._24_4_ = uVar1;
      local_13a0._28_4_ = uVar1;
      auVar205 = ZEXT3264(local_13a0);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_13c0._4_4_ = uVar1;
      local_13c0._0_4_ = uVar1;
      local_13c0._8_4_ = uVar1;
      local_13c0._12_4_ = uVar1;
      local_13c0._16_4_ = uVar1;
      local_13c0._20_4_ = uVar1;
      local_13c0._24_4_ = uVar1;
      local_13c0._28_4_ = uVar1;
      auVar213 = ZEXT3264(local_13c0);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_13e0._4_4_ = uVar1;
      local_13e0._0_4_ = uVar1;
      local_13e0._8_4_ = uVar1;
      local_13e0._12_4_ = uVar1;
      local_13e0._16_4_ = uVar1;
      local_13e0._20_4_ = uVar1;
      local_13e0._24_4_ = uVar1;
      local_13e0._28_4_ = uVar1;
      auVar215 = ZEXT3264(local_13e0);
      auVar147 = vshufps_avx(auVar138,auVar138,0);
      local_1400._16_16_ = auVar147;
      local_1400._0_16_ = auVar147;
      auVar217 = ZEXT3264(local_1400);
      auVar147 = vmovshdup_avx(auVar138);
      auVar153 = vshufps_avx(auVar138,auVar138,0x55);
      local_1420._16_16_ = auVar153;
      local_1420._0_16_ = auVar153;
      auVar218 = ZEXT3264(local_1420);
      auVar153 = vshufpd_avx(auVar138,auVar138,1);
      auVar137 = vshufps_avx(auVar138,auVar138,0xaa);
      register0x00001390 = auVar137;
      _local_14a0 = auVar137;
      auVar165 = ZEXT3264(_local_14a0);
      local_1630 = (ulong)(auVar138._0_4_ < 0.0) << 5;
      local_1638 = (ulong)(auVar147._0_4_ < 0.0) << 5 | 0x40;
      local_1640 = (ulong)(auVar153._0_4_ < 0.0) << 5 | 0x80;
      local_1648 = local_1630 ^ 0x20;
      local_1650 = local_1638 ^ 0x20;
      local_1658 = local_1640 ^ 0x20;
      auVar147 = vshufps_avx(auVar115,auVar115,0);
      local_14c0._16_16_ = auVar147;
      local_14c0._0_16_ = auVar147;
      auVar152 = ZEXT3264(local_14c0);
      auVar147 = vshufps_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),0);
      local_14e0._16_16_ = auVar147;
      local_14e0._0_16_ = auVar147;
      auVar160 = ZEXT3264(local_14e0);
      local_15f8 = (ulong)(((uint)(auVar138._0_4_ < 0.0) << 5) >> 2);
      local_1600 = local_1648 >> 2;
      local_1608 = local_1638 >> 2;
      local_1610 = local_1650 >> 2;
      local_1618 = local_1640 >> 2;
      local_1480._16_16_ = mm_lookupmask_ps._240_16_;
      local_1480._0_16_ = mm_lookupmask_ps._240_16_;
      local_1440 = vperm2f128_avx(local_1480,mm_lookupmask_ps._0_32_,2);
      local_1620 = local_1658 >> 2;
      auVar127._8_4_ = 0xbf800000;
      auVar127._0_8_ = 0xbf800000bf800000;
      auVar127._12_4_ = 0xbf800000;
      auVar127._16_4_ = 0xbf800000;
      auVar127._20_4_ = 0xbf800000;
      auVar127._24_4_ = 0xbf800000;
      auVar127._28_4_ = 0xbf800000;
      auVar132._8_4_ = 0x3f800000;
      auVar132._0_8_ = 0x3f8000003f800000;
      auVar132._12_4_ = 0x3f800000;
      auVar132._16_4_ = 0x3f800000;
      auVar132._20_4_ = 0x3f800000;
      auVar132._24_4_ = 0x3f800000;
      auVar132._28_4_ = 0x3f800000;
      _local_1460 = vblendvps_avx(auVar132,auVar127,local_1440);
      uVar113 = local_1648;
      uVar99 = local_1630;
      uVar101 = local_1638;
      uVar108 = local_1640;
      uVar109 = local_1658;
      uVar112 = local_1650;
LAB_002f21f9:
      do {
        uVar111 = local_1628[-1];
        local_1628 = local_1628 + -1;
        while ((uVar111 & 8) == 0) {
          auVar127 = vsubps_avx(*(undefined1 (*) [32])(uVar111 + 0x40 + uVar99),auVar205._0_32_);
          auVar10._4_4_ = auVar217._4_4_ * auVar127._4_4_;
          auVar10._0_4_ = auVar217._0_4_ * auVar127._0_4_;
          auVar10._8_4_ = auVar217._8_4_ * auVar127._8_4_;
          auVar10._12_4_ = auVar217._12_4_ * auVar127._12_4_;
          auVar10._16_4_ = auVar217._16_4_ * auVar127._16_4_;
          auVar10._20_4_ = auVar217._20_4_ * auVar127._20_4_;
          auVar10._24_4_ = auVar217._24_4_ * auVar127._24_4_;
          auVar10._28_4_ = auVar127._28_4_;
          auVar127 = vsubps_avx(*(undefined1 (*) [32])(uVar111 + 0x40 + uVar101),auVar213._0_32_);
          auVar68._4_4_ = auVar218._4_4_ * auVar127._4_4_;
          auVar68._0_4_ = auVar218._0_4_ * auVar127._0_4_;
          auVar68._8_4_ = auVar218._8_4_ * auVar127._8_4_;
          auVar68._12_4_ = auVar218._12_4_ * auVar127._12_4_;
          auVar68._16_4_ = auVar218._16_4_ * auVar127._16_4_;
          auVar68._20_4_ = auVar218._20_4_ * auVar127._20_4_;
          auVar68._24_4_ = auVar218._24_4_ * auVar127._24_4_;
          auVar68._28_4_ = auVar127._28_4_;
          auVar127 = vmaxps_avx(auVar10,auVar68);
          auVar132 = vsubps_avx(*(undefined1 (*) [32])(uVar111 + 0x40 + uVar108),auVar215._0_32_);
          auVar69._4_4_ = auVar165._4_4_ * auVar132._4_4_;
          auVar69._0_4_ = auVar165._0_4_ * auVar132._0_4_;
          auVar69._8_4_ = auVar165._8_4_ * auVar132._8_4_;
          auVar69._12_4_ = auVar165._12_4_ * auVar132._12_4_;
          auVar69._16_4_ = auVar165._16_4_ * auVar132._16_4_;
          auVar69._20_4_ = auVar165._20_4_ * auVar132._20_4_;
          auVar69._24_4_ = auVar165._24_4_ * auVar132._24_4_;
          auVar69._28_4_ = auVar132._28_4_;
          auVar132 = vsubps_avx(*(undefined1 (*) [32])(uVar111 + 0x40 + uVar113),auVar205._0_32_);
          auVar70._4_4_ = auVar217._4_4_ * auVar132._4_4_;
          auVar70._0_4_ = auVar217._0_4_ * auVar132._0_4_;
          auVar70._8_4_ = auVar217._8_4_ * auVar132._8_4_;
          auVar70._12_4_ = auVar217._12_4_ * auVar132._12_4_;
          auVar70._16_4_ = auVar217._16_4_ * auVar132._16_4_;
          auVar70._20_4_ = auVar217._20_4_ * auVar132._20_4_;
          auVar70._24_4_ = auVar217._24_4_ * auVar132._24_4_;
          auVar70._28_4_ = auVar132._28_4_;
          auVar132 = vsubps_avx(*(undefined1 (*) [32])(uVar111 + 0x40 + uVar112),auVar213._0_32_);
          auVar71._4_4_ = auVar218._4_4_ * auVar132._4_4_;
          auVar71._0_4_ = auVar218._0_4_ * auVar132._0_4_;
          auVar71._8_4_ = auVar218._8_4_ * auVar132._8_4_;
          auVar71._12_4_ = auVar218._12_4_ * auVar132._12_4_;
          auVar71._16_4_ = auVar218._16_4_ * auVar132._16_4_;
          auVar71._20_4_ = auVar218._20_4_ * auVar132._20_4_;
          auVar71._24_4_ = auVar218._24_4_ * auVar132._24_4_;
          auVar71._28_4_ = auVar132._28_4_;
          auVar10 = vminps_avx(auVar70,auVar71);
          auVar132 = vsubps_avx(*(undefined1 (*) [32])(uVar111 + 0x40 + uVar109),auVar215._0_32_);
          auVar72._4_4_ = auVar165._4_4_ * auVar132._4_4_;
          auVar72._0_4_ = auVar165._0_4_ * auVar132._0_4_;
          auVar72._8_4_ = auVar165._8_4_ * auVar132._8_4_;
          auVar72._12_4_ = auVar165._12_4_ * auVar132._12_4_;
          auVar72._16_4_ = auVar165._16_4_ * auVar132._16_4_;
          auVar72._20_4_ = auVar165._20_4_ * auVar132._20_4_;
          auVar72._24_4_ = auVar165._24_4_ * auVar132._24_4_;
          auVar72._28_4_ = auVar132._28_4_;
          auVar132 = vmaxps_avx(auVar69,auVar152._0_32_);
          auVar127 = vmaxps_avx(auVar127,auVar132);
          auVar132 = vminps_avx(auVar72,auVar160._0_32_);
          auVar132 = vminps_avx(auVar10,auVar132);
          auVar127 = vcmpps_avx(auVar127,auVar132,2);
          uVar102 = vmovmskps_avx(auVar127);
          if (uVar102 == 0) {
            if (local_1628 == &local_1200) {
              return;
            }
            goto LAB_002f21f9;
          }
          uVar102 = uVar102 & 0xff;
          uVar97 = uVar111 & 0xfffffffffffffff0;
          lVar98 = 0;
          if (uVar102 != 0) {
            for (; (uVar102 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
            }
          }
          uVar111 = *(ulong *)(uVar97 + lVar98 * 8);
          uVar102 = uVar102 - 1 & uVar102;
          if (uVar102 != 0) {
            *local_1628 = uVar111;
            local_1628 = local_1628 + 1;
            lVar98 = 0;
            if (uVar102 != 0) {
              for (; (uVar102 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
              }
            }
            uVar111 = *(ulong *)(uVar97 + lVar98 * 8);
            uVar102 = uVar102 - 1 & uVar102;
            uVar103 = (ulong)uVar102;
            if (uVar102 != 0) {
              do {
                *local_1628 = uVar111;
                local_1628 = local_1628 + 1;
                lVar98 = 0;
                if (uVar103 != 0) {
                  for (; (uVar103 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                  }
                }
                uVar111 = *(ulong *)(uVar97 + lVar98 * 8);
                uVar103 = uVar103 & uVar103 - 1;
              } while (uVar103 != 0);
            }
          }
        }
        local_15f0 = (ulong)((uint)uVar111 & 0xf) - 8;
        if (local_15f0 != 0) {
          uVar111 = uVar111 & 0xfffffffffffffff0;
          local_15e8 = 0;
          do {
            lVar98 = local_15e8 * 0x90;
            local_15c8 = uVar111 + lVar98;
            auVar115._8_8_ = 0;
            auVar115._0_8_ = *(ulong *)(uVar111 + 0x40 + lVar98);
            auVar130._8_8_ = 0;
            auVar130._0_8_ = *(ulong *)(uVar111 + 0x48 + lVar98);
            auVar147 = vpminub_avx(auVar115,auVar130);
            auVar147 = vpcmpeqb_avx(auVar115,auVar147);
            auVar126._8_8_ = 0;
            auVar126._0_8_ = *(ulong *)(uVar111 + 0x44 + lVar98);
            auVar139._8_8_ = 0;
            auVar139._0_8_ = *(ulong *)(uVar111 + 0x4c + lVar98);
            auVar115 = vpminub_avx(auVar126,auVar139);
            fVar114 = *(float *)(uVar111 + 0x70 + lVar98);
            auVar115 = vpcmpeqb_avx(auVar126,auVar115);
            fVar119 = *(float *)(uVar111 + 0x7c + lVar98);
            auVar131._8_8_ = 0;
            auVar131._0_8_ = *(ulong *)(local_15f8 + 0x40 + local_15c8);
            auVar153 = vpmovzxbd_avx(auVar131);
            auVar155._8_8_ = 0;
            auVar155._0_8_ = *(ulong *)(local_15f8 + 0x44 + local_15c8);
            auVar137 = vpmovzxbd_avx(auVar155);
            auVar133._16_16_ = auVar137;
            auVar133._0_16_ = auVar153;
            auVar127 = vcvtdq2ps_avx(auVar133);
            auVar134._0_4_ = fVar114 + fVar119 * auVar127._0_4_;
            auVar134._4_4_ = fVar114 + fVar119 * auVar127._4_4_;
            auVar134._8_4_ = fVar114 + fVar119 * auVar127._8_4_;
            auVar134._12_4_ = fVar114 + fVar119 * auVar127._12_4_;
            auVar134._16_4_ = fVar114 + fVar119 * auVar127._16_4_;
            auVar134._20_4_ = fVar114 + fVar119 * auVar127._20_4_;
            auVar134._24_4_ = fVar114 + fVar119 * auVar127._24_4_;
            auVar134._28_4_ = fVar114 + auVar127._28_4_;
            auVar156._8_8_ = 0;
            auVar156._0_8_ = *(ulong *)(local_1600 + 0x40 + local_15c8);
            auVar153 = vpmovzxbd_avx(auVar156);
            auVar161._8_8_ = 0;
            auVar161._0_8_ = *(ulong *)(local_1600 + 0x44 + local_15c8);
            auVar137 = vpmovzxbd_avx(auVar161);
            auVar157._16_16_ = auVar137;
            auVar157._0_16_ = auVar153;
            auVar127 = vcvtdq2ps_avx(auVar157);
            fVar120 = *(float *)(uVar111 + 0x74 + lVar98);
            auVar140._0_4_ = fVar114 + fVar119 * auVar127._0_4_;
            auVar140._4_4_ = fVar114 + fVar119 * auVar127._4_4_;
            auVar140._8_4_ = fVar114 + fVar119 * auVar127._8_4_;
            auVar140._12_4_ = fVar114 + fVar119 * auVar127._12_4_;
            auVar140._16_4_ = fVar114 + fVar119 * auVar127._16_4_;
            auVar140._20_4_ = fVar114 + fVar119 * auVar127._20_4_;
            auVar140._24_4_ = fVar114 + fVar119 * auVar127._24_4_;
            auVar140._28_4_ = fVar114 + fVar119;
            fVar114 = *(float *)(uVar111 + 0x80 + lVar98);
            auVar145._8_8_ = 0;
            auVar145._0_8_ = *(ulong *)(local_1608 + 0x40 + local_15c8);
            auVar153 = vpmovzxbd_avx(auVar145);
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(local_1608 + 0x44 + local_15c8);
            auVar137 = vpmovzxbd_avx(auVar166);
            auVar148._16_16_ = auVar137;
            auVar148._0_16_ = auVar153;
            auVar127 = vcvtdq2ps_avx(auVar148);
            auVar149._0_4_ = fVar120 + fVar114 * auVar127._0_4_;
            auVar149._4_4_ = fVar120 + fVar114 * auVar127._4_4_;
            auVar149._8_4_ = fVar120 + fVar114 * auVar127._8_4_;
            auVar149._12_4_ = fVar120 + fVar114 * auVar127._12_4_;
            auVar149._16_4_ = fVar120 + fVar114 * auVar127._16_4_;
            auVar149._20_4_ = fVar120 + fVar114 * auVar127._20_4_;
            auVar149._24_4_ = fVar120 + fVar114 * auVar127._24_4_;
            auVar149._28_4_ = fVar120 + auVar127._28_4_;
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(local_1610 + 0x40 + local_15c8);
            auVar153 = vpmovzxbd_avx(auVar167);
            auVar170._8_8_ = 0;
            auVar170._0_8_ = *(ulong *)(local_1610 + 0x44 + local_15c8);
            auVar137 = vpmovzxbd_avx(auVar170);
            auVar168._16_16_ = auVar137;
            auVar168._0_16_ = auVar153;
            auVar127 = vcvtdq2ps_avx(auVar168);
            fVar119 = *(float *)(uVar111 + 0x78 + lVar98);
            auVar158._0_4_ = fVar120 + fVar114 * auVar127._0_4_;
            auVar158._4_4_ = fVar120 + fVar114 * auVar127._4_4_;
            auVar158._8_4_ = fVar120 + fVar114 * auVar127._8_4_;
            auVar158._12_4_ = fVar120 + fVar114 * auVar127._12_4_;
            auVar158._16_4_ = fVar120 + fVar114 * auVar127._16_4_;
            auVar158._20_4_ = fVar120 + fVar114 * auVar127._20_4_;
            auVar158._24_4_ = fVar120 + fVar114 * auVar127._24_4_;
            auVar158._28_4_ = fVar120 + fVar114;
            fVar114 = *(float *)(uVar111 + 0x84 + lVar98);
            auVar171._8_8_ = 0;
            auVar171._0_8_ = *(ulong *)(local_1618 + 0x40 + local_15c8);
            auVar153 = vpmovzxbd_avx(auVar171);
            auVar176._8_8_ = 0;
            auVar176._0_8_ = *(ulong *)(local_1618 + 0x44 + local_15c8);
            auVar137 = vpmovzxbd_avx(auVar176);
            auVar172._16_16_ = auVar137;
            auVar172._0_16_ = auVar153;
            auVar177._8_8_ = 0;
            auVar177._0_8_ = *(ulong *)(local_1620 + 0x40 + local_15c8);
            auVar153 = vpmovzxbd_avx(auVar177);
            auVar195._8_8_ = 0;
            auVar195._0_8_ = *(ulong *)(local_1620 + 0x44 + local_15c8);
            auVar137 = vpmovzxbd_avx(auVar195);
            auVar179._16_16_ = auVar137;
            auVar179._0_16_ = auVar153;
            auVar127 = vcvtdq2ps_avx(auVar172);
            auVar132 = vcvtdq2ps_avx(auVar179);
            auVar173._0_4_ = auVar127._0_4_ * fVar114 + fVar119;
            auVar173._4_4_ = auVar127._4_4_ * fVar114 + fVar119;
            auVar173._8_4_ = auVar127._8_4_ * fVar114 + fVar119;
            auVar173._12_4_ = auVar127._12_4_ * fVar114 + fVar119;
            auVar173._16_4_ = auVar127._16_4_ * fVar114 + fVar119;
            auVar173._20_4_ = auVar127._20_4_ * fVar114 + fVar119;
            auVar173._24_4_ = auVar127._24_4_ * fVar114 + fVar119;
            auVar173._28_4_ = auVar127._28_4_ + fVar119;
            auVar162._0_4_ = fVar119 + auVar132._0_4_ * fVar114;
            auVar162._4_4_ = fVar119 + auVar132._4_4_ * fVar114;
            auVar162._8_4_ = fVar119 + auVar132._8_4_ * fVar114;
            auVar162._12_4_ = fVar119 + auVar132._12_4_ * fVar114;
            auVar162._16_4_ = fVar119 + auVar132._16_4_ * fVar114;
            auVar162._20_4_ = fVar119 + auVar132._20_4_ * fVar114;
            auVar162._24_4_ = fVar119 + auVar132._24_4_ * fVar114;
            auVar162._28_4_ = fVar119 + fVar114;
            auVar127 = vsubps_avx(auVar134,auVar205._0_32_);
            auVar73._4_4_ = auVar217._4_4_ * auVar127._4_4_;
            auVar73._0_4_ = auVar217._0_4_ * auVar127._0_4_;
            auVar73._8_4_ = auVar217._8_4_ * auVar127._8_4_;
            auVar73._12_4_ = auVar217._12_4_ * auVar127._12_4_;
            auVar73._16_4_ = auVar217._16_4_ * auVar127._16_4_;
            auVar73._20_4_ = auVar217._20_4_ * auVar127._20_4_;
            auVar73._24_4_ = auVar217._24_4_ * auVar127._24_4_;
            auVar73._28_4_ = auVar127._28_4_;
            auVar127 = vsubps_avx(auVar149,auVar213._0_32_);
            auVar74._4_4_ = auVar218._4_4_ * auVar127._4_4_;
            auVar74._0_4_ = auVar218._0_4_ * auVar127._0_4_;
            auVar74._8_4_ = auVar218._8_4_ * auVar127._8_4_;
            auVar74._12_4_ = auVar218._12_4_ * auVar127._12_4_;
            auVar74._16_4_ = auVar218._16_4_ * auVar127._16_4_;
            auVar74._20_4_ = auVar218._20_4_ * auVar127._20_4_;
            auVar74._24_4_ = auVar218._24_4_ * auVar127._24_4_;
            auVar74._28_4_ = auVar127._28_4_;
            auVar127 = vmaxps_avx(auVar73,auVar74);
            auVar132 = vsubps_avx(auVar140,auVar205._0_32_);
            auVar75._4_4_ = auVar217._4_4_ * auVar132._4_4_;
            auVar75._0_4_ = auVar217._0_4_ * auVar132._0_4_;
            auVar75._8_4_ = auVar217._8_4_ * auVar132._8_4_;
            auVar75._12_4_ = auVar217._12_4_ * auVar132._12_4_;
            auVar75._16_4_ = auVar217._16_4_ * auVar132._16_4_;
            auVar75._20_4_ = auVar217._20_4_ * auVar132._20_4_;
            auVar75._24_4_ = auVar217._24_4_ * auVar132._24_4_;
            auVar75._28_4_ = auVar132._28_4_;
            auVar132 = vsubps_avx(auVar158,auVar213._0_32_);
            auVar76._4_4_ = auVar218._4_4_ * auVar132._4_4_;
            auVar76._0_4_ = auVar218._0_4_ * auVar132._0_4_;
            auVar76._8_4_ = auVar218._8_4_ * auVar132._8_4_;
            auVar76._12_4_ = auVar218._12_4_ * auVar132._12_4_;
            auVar76._16_4_ = auVar218._16_4_ * auVar132._16_4_;
            auVar76._20_4_ = auVar218._20_4_ * auVar132._20_4_;
            auVar76._24_4_ = auVar218._24_4_ * auVar132._24_4_;
            auVar76._28_4_ = auVar132._28_4_;
            auVar10 = vminps_avx(auVar75,auVar76);
            auVar132 = vsubps_avx(auVar173,auVar215._0_32_);
            auVar77._4_4_ = (float)local_14a0._4_4_ * auVar132._4_4_;
            auVar77._0_4_ = (float)local_14a0._0_4_ * auVar132._0_4_;
            auVar77._8_4_ = fStack_1498 * auVar132._8_4_;
            auVar77._12_4_ = fStack_1494 * auVar132._12_4_;
            auVar77._16_4_ = fStack_1490 * auVar132._16_4_;
            auVar77._20_4_ = fStack_148c * auVar132._20_4_;
            auVar77._24_4_ = fStack_1488 * auVar132._24_4_;
            auVar77._28_4_ = auVar132._28_4_;
            auVar132 = vmaxps_avx(auVar77,local_14c0);
            auVar127 = vmaxps_avx(auVar127,auVar132);
            auVar132 = vsubps_avx(auVar162,auVar215._0_32_);
            auVar78._4_4_ = (float)local_14a0._4_4_ * auVar132._4_4_;
            auVar78._0_4_ = (float)local_14a0._0_4_ * auVar132._0_4_;
            auVar78._8_4_ = fStack_1498 * auVar132._8_4_;
            auVar78._12_4_ = fStack_1494 * auVar132._12_4_;
            auVar78._16_4_ = fStack_1490 * auVar132._16_4_;
            auVar78._20_4_ = fStack_148c * auVar132._20_4_;
            auVar78._24_4_ = fStack_1488 * auVar132._24_4_;
            auVar78._28_4_ = auVar132._28_4_;
            auVar132 = vminps_avx(auVar78,local_14e0);
            auVar132 = vminps_avx(auVar10,auVar132);
            auVar127 = vcmpps_avx(auVar127,auVar132,2);
            auVar153 = vpcmpeqd_avx(auVar132._0_16_,auVar132._0_16_);
            auVar147 = vpmovsxbd_avx(auVar147 ^ auVar153);
            auVar115 = vpmovsxbd_avx(auVar115 ^ auVar153);
            auVar116._16_16_ = auVar115;
            auVar116._0_16_ = auVar147;
            auVar132 = vcvtdq2ps_avx(auVar116);
            auVar128._8_4_ = 0xbf800000;
            auVar128._0_8_ = 0xbf800000bf800000;
            auVar128._12_4_ = 0xbf800000;
            auVar128._16_4_ = 0xbf800000;
            auVar128._20_4_ = 0xbf800000;
            auVar128._24_4_ = 0xbf800000;
            auVar128._28_4_ = 0xbf800000;
            auVar132 = vcmpps_avx(auVar128,auVar132,1);
            auVar127 = vandps_avx(auVar127,auVar132);
            uVar102 = vmovmskps_avx(auVar127);
            if (uVar102 != 0) {
              uVar113 = (ulong)(uVar102 & 0xff);
              do {
                lVar98 = 0;
                if (uVar113 != 0) {
                  for (; (uVar113 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                  }
                }
                uVar5 = *(ushort *)(local_15c8 + lVar98 * 8);
                uVar6 = *(ushort *)(local_15c8 + 2 + lVar98 * 8);
                uVar102 = *(uint *)(local_15c8 + 0x88);
                uVar7 = *(uint *)(local_15c8 + 4 + lVar98 * 8);
                local_15d8 = (ulong)uVar102;
                local_1660 = (context->scene->geometries).items[uVar102].ptr;
                local_15d0 = *(long *)&local_1660->field_0x58;
                local_15e0 = (ulong)uVar7;
                lVar104 = local_1660[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                          ._M_i * (ulong)uVar7;
                uVar106 = uVar5 & 0x7fff;
                uVar107 = uVar6 & 0x7fff;
                uVar105 = *(uint *)(local_15d0 + 4 + lVar104);
                uVar108 = (ulong)uVar105;
                uVar101 = (ulong)(uVar105 * uVar107 + *(int *)(local_15d0 + lVar104) + uVar106);
                p_Var8 = local_1660[1].intersectionFilterN;
                lVar98 = *(long *)&local_1660[1].time_range.upper;
                auVar147 = *(undefined1 (*) [16])(lVar98 + (long)p_Var8 * uVar101);
                auVar115 = *(undefined1 (*) [16])(lVar98 + (uVar101 + 1) * (long)p_Var8);
                auVar153 = *(undefined1 (*) [16])(lVar98 + (uVar101 + uVar108) * (long)p_Var8);
                lVar110 = uVar101 + uVar108 + 1;
                auVar137 = *(undefined1 (*) [16])(lVar98 + lVar110 * (long)p_Var8);
                uVar99 = (ulong)(-1 < (short)uVar5);
                auVar138 = *(undefined1 (*) [16])(lVar98 + (uVar101 + uVar99 + 1) * (long)p_Var8);
                lVar100 = uVar99 + lVar110;
                auVar154 = *(undefined1 (*) [16])(lVar98 + lVar100 * (long)p_Var8);
                uVar99 = 0;
                if (-1 < (short)uVar6) {
                  uVar99 = uVar108;
                }
                auVar126 = *(undefined1 (*) [16])
                            (lVar98 + (uVar101 + uVar108 + uVar99) * (long)p_Var8);
                auVar130 = *(undefined1 (*) [16])(lVar98 + (lVar110 + uVar99) * (long)p_Var8);
                auVar131 = *(undefined1 (*) [16])(lVar98 + (uVar99 + lVar100) * (long)p_Var8);
                auVar145 = vunpcklps_avx(auVar147,auVar137);
                auVar147 = vunpckhps_avx(auVar147,auVar137);
                auVar155 = vunpcklps_avx(auVar115,auVar153);
                auVar139 = vunpckhps_avx(auVar115,auVar153);
                auVar139 = vunpcklps_avx(auVar147,auVar139);
                auVar156 = vunpcklps_avx(auVar145,auVar155);
                auVar147 = vunpckhps_avx(auVar145,auVar155);
                auVar145 = vunpcklps_avx(auVar115,auVar154);
                auVar115 = vunpckhps_avx(auVar115,auVar154);
                auVar155 = vunpcklps_avx(auVar138,auVar137);
                auVar138 = vunpckhps_avx(auVar138,auVar137);
                auVar161 = vunpcklps_avx(auVar115,auVar138);
                auVar166 = vunpcklps_avx(auVar145,auVar155);
                auVar115 = vunpckhps_avx(auVar145,auVar155);
                auVar145 = vunpcklps_avx(auVar137,auVar131);
                auVar138 = vunpckhps_avx(auVar137,auVar131);
                auVar131 = vunpcklps_avx(auVar154,auVar130);
                auVar154 = vunpckhps_avx(auVar154,auVar130);
                auVar154 = vunpcklps_avx(auVar138,auVar154);
                auVar155 = vunpcklps_avx(auVar145,auVar131);
                auVar138 = vunpckhps_avx(auVar145,auVar131);
                auVar131 = vunpcklps_avx(auVar153,auVar130);
                auVar153 = vunpckhps_avx(auVar153,auVar130);
                auVar130 = vunpcklps_avx(auVar137,auVar126);
                auVar137 = vunpckhps_avx(auVar137,auVar126);
                auVar137 = vunpcklps_avx(auVar153,auVar137);
                auVar126 = vunpcklps_avx(auVar131,auVar130);
                auVar153 = vunpckhps_avx(auVar131,auVar130);
                auVar129._16_16_ = auVar155;
                auVar129._0_16_ = auVar156;
                auVar159._16_16_ = auVar138;
                auVar159._0_16_ = auVar147;
                auVar169._16_16_ = auVar154;
                auVar169._0_16_ = auVar139;
                auVar141._16_16_ = auVar166;
                auVar141._0_16_ = auVar166;
                auVar150._16_16_ = auVar115;
                auVar150._0_16_ = auVar115;
                auVar135._16_16_ = auVar161;
                auVar135._0_16_ = auVar161;
                auVar180._16_16_ = auVar126;
                auVar180._0_16_ = auVar126;
                auVar196._16_16_ = auVar153;
                auVar196._0_16_ = auVar153;
                auVar204._16_16_ = auVar137;
                auVar204._0_16_ = auVar137;
                local_1520 = vsubps_avx(auVar129,auVar141);
                local_1540 = vsubps_avx(auVar159,auVar150);
                auVar127 = vsubps_avx(auVar169,auVar135);
                auVar132 = vsubps_avx(auVar180,auVar129);
                auVar10 = vsubps_avx(auVar196,auVar159);
                auVar68 = vsubps_avx(auVar204,auVar169);
                fVar121 = local_1540._0_4_;
                fVar203 = auVar68._0_4_;
                fVar14 = local_1540._4_4_;
                fVar206 = auVar68._4_4_;
                auVar79._4_4_ = fVar206 * fVar14;
                auVar79._0_4_ = fVar203 * fVar121;
                fVar23 = local_1540._8_4_;
                fVar207 = auVar68._8_4_;
                auVar79._8_4_ = fVar207 * fVar23;
                fVar32 = local_1540._12_4_;
                fVar208 = auVar68._12_4_;
                auVar79._12_4_ = fVar208 * fVar32;
                fVar41 = local_1540._16_4_;
                fVar209 = auVar68._16_4_;
                auVar79._16_4_ = fVar209 * fVar41;
                fVar50 = local_1540._20_4_;
                fVar210 = auVar68._20_4_;
                auVar79._20_4_ = fVar210 * fVar50;
                fVar59 = local_1540._24_4_;
                fVar211 = auVar68._24_4_;
                auVar79._24_4_ = fVar211 * fVar59;
                auVar79._28_4_ = auVar161._12_4_;
                fVar123 = auVar127._0_4_;
                fVar194 = auVar10._0_4_;
                fVar15 = auVar127._4_4_;
                fVar197 = auVar10._4_4_;
                auVar81._4_4_ = fVar197 * fVar15;
                auVar81._0_4_ = fVar194 * fVar123;
                fVar24 = auVar127._8_4_;
                fVar198 = auVar10._8_4_;
                auVar81._8_4_ = fVar198 * fVar24;
                fVar33 = auVar127._12_4_;
                fVar199 = auVar10._12_4_;
                auVar81._12_4_ = fVar199 * fVar33;
                fVar42 = auVar127._16_4_;
                fVar200 = auVar10._16_4_;
                auVar81._16_4_ = fVar200 * fVar42;
                fVar51 = auVar127._20_4_;
                fVar201 = auVar10._20_4_;
                auVar81._20_4_ = fVar201 * fVar51;
                fVar60 = auVar127._24_4_;
                uVar80 = auVar166._12_4_;
                fVar202 = auVar10._24_4_;
                auVar81._24_4_ = fVar202 * fVar60;
                auVar81._28_4_ = uVar80;
                local_1500 = vsubps_avx(auVar81,auVar79);
                fVar175 = auVar132._0_4_;
                fVar181 = auVar132._4_4_;
                auVar82._4_4_ = fVar181 * fVar15;
                auVar82._0_4_ = fVar175 * fVar123;
                fVar183 = auVar132._8_4_;
                auVar82._8_4_ = fVar183 * fVar24;
                fVar185 = auVar132._12_4_;
                auVar82._12_4_ = fVar185 * fVar33;
                fVar187 = auVar132._16_4_;
                auVar82._16_4_ = fVar187 * fVar42;
                fVar189 = auVar132._20_4_;
                auVar82._20_4_ = fVar189 * fVar51;
                fVar191 = auVar132._24_4_;
                auVar82._24_4_ = fVar191 * fVar60;
                auVar82._28_4_ = uVar80;
                fVar125 = local_1520._0_4_;
                fVar16 = local_1520._4_4_;
                auVar84._4_4_ = fVar206 * fVar16;
                auVar84._0_4_ = fVar203 * fVar125;
                fVar25 = local_1520._8_4_;
                auVar84._8_4_ = fVar207 * fVar25;
                fVar34 = local_1520._12_4_;
                auVar84._12_4_ = fVar208 * fVar34;
                fVar43 = local_1520._16_4_;
                auVar84._16_4_ = fVar209 * fVar43;
                fVar52 = local_1520._20_4_;
                auVar84._20_4_ = fVar210 * fVar52;
                fVar61 = local_1520._24_4_;
                fVar83 = auVar115._12_4_;
                auVar84._24_4_ = fVar211 * fVar61;
                auVar84._28_4_ = fVar83;
                auVar127 = vsubps_avx(auVar84,auVar82);
                auVar85._4_4_ = fVar197 * fVar16;
                auVar85._0_4_ = fVar194 * fVar125;
                auVar85._8_4_ = fVar198 * fVar25;
                auVar85._12_4_ = fVar199 * fVar34;
                auVar85._16_4_ = fVar200 * fVar43;
                auVar85._20_4_ = fVar201 * fVar52;
                auVar85._24_4_ = fVar202 * fVar61;
                auVar85._28_4_ = fVar83;
                auVar86._4_4_ = fVar181 * fVar14;
                auVar86._0_4_ = fVar175 * fVar121;
                auVar86._8_4_ = fVar183 * fVar23;
                auVar86._12_4_ = fVar185 * fVar32;
                auVar86._16_4_ = fVar187 * fVar41;
                auVar86._20_4_ = fVar189 * fVar50;
                auVar86._24_4_ = fVar191 * fVar59;
                auVar86._28_4_ = local_1540._28_4_;
                local_1560 = vsubps_avx(auVar86,auVar85);
                uVar1 = *(undefined4 *)&(ray->org).field_0;
                auVar212._4_4_ = uVar1;
                auVar212._0_4_ = uVar1;
                auVar212._8_4_ = uVar1;
                auVar212._12_4_ = uVar1;
                auVar212._16_4_ = uVar1;
                auVar212._20_4_ = uVar1;
                auVar212._24_4_ = uVar1;
                auVar212._28_4_ = uVar1;
                uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
                auVar214._4_4_ = uVar1;
                auVar214._0_4_ = uVar1;
                auVar214._8_4_ = uVar1;
                auVar214._12_4_ = uVar1;
                auVar214._16_4_ = uVar1;
                auVar214._20_4_ = uVar1;
                auVar214._24_4_ = uVar1;
                auVar214._28_4_ = uVar1;
                uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
                auVar216._4_4_ = uVar2;
                auVar216._0_4_ = uVar2;
                auVar216._8_4_ = uVar2;
                auVar216._12_4_ = uVar2;
                auVar216._16_4_ = uVar2;
                auVar216._20_4_ = uVar2;
                auVar216._24_4_ = uVar2;
                auVar216._28_4_ = uVar2;
                fVar114 = (ray->dir).field_0.m128[1];
                auVar69 = vsubps_avx(auVar129,auVar212);
                fVar119 = (ray->dir).field_0.m128[2];
                auVar70 = vsubps_avx(auVar159,auVar214);
                auVar71 = vsubps_avx(auVar169,auVar216);
                fVar122 = auVar71._0_4_;
                fVar17 = auVar71._4_4_;
                auVar87._4_4_ = fVar114 * fVar17;
                auVar87._0_4_ = fVar114 * fVar122;
                fVar26 = auVar71._8_4_;
                auVar87._8_4_ = fVar114 * fVar26;
                fVar35 = auVar71._12_4_;
                auVar87._12_4_ = fVar114 * fVar35;
                fVar44 = auVar71._16_4_;
                auVar87._16_4_ = fVar114 * fVar44;
                fVar53 = auVar71._20_4_;
                auVar87._20_4_ = fVar114 * fVar53;
                fVar62 = auVar71._24_4_;
                auVar87._24_4_ = fVar114 * fVar62;
                auVar87._28_4_ = uVar1;
                fVar124 = auVar70._0_4_;
                fVar18 = auVar70._4_4_;
                auVar88._4_4_ = fVar119 * fVar18;
                auVar88._0_4_ = fVar119 * fVar124;
                fVar27 = auVar70._8_4_;
                auVar88._8_4_ = fVar119 * fVar27;
                fVar36 = auVar70._12_4_;
                auVar88._12_4_ = fVar119 * fVar36;
                fVar45 = auVar70._16_4_;
                auVar88._16_4_ = fVar119 * fVar45;
                fVar54 = auVar70._20_4_;
                auVar88._20_4_ = fVar119 * fVar54;
                fVar63 = auVar70._24_4_;
                auVar88._24_4_ = fVar119 * fVar63;
                auVar88._28_4_ = uVar2;
                auVar70 = vsubps_avx(auVar88,auVar87);
                fVar120 = (ray->dir).field_0.m128[0];
                fVar118 = auVar69._0_4_;
                fVar19 = auVar69._4_4_;
                auVar89._4_4_ = fVar119 * fVar19;
                auVar89._0_4_ = fVar119 * fVar118;
                fVar28 = auVar69._8_4_;
                auVar89._8_4_ = fVar119 * fVar28;
                fVar37 = auVar69._12_4_;
                auVar89._12_4_ = fVar119 * fVar37;
                fVar46 = auVar69._16_4_;
                auVar89._16_4_ = fVar119 * fVar46;
                fVar55 = auVar69._20_4_;
                auVar89._20_4_ = fVar119 * fVar55;
                fVar64 = auVar69._24_4_;
                auVar89._24_4_ = fVar119 * fVar64;
                auVar89._28_4_ = local_1500._28_4_;
                auVar90._4_4_ = fVar120 * fVar17;
                auVar90._0_4_ = fVar120 * fVar122;
                auVar90._8_4_ = fVar120 * fVar26;
                auVar90._12_4_ = fVar120 * fVar35;
                auVar90._16_4_ = fVar120 * fVar44;
                auVar90._20_4_ = fVar120 * fVar53;
                auVar90._24_4_ = fVar120 * fVar62;
                auVar90._28_4_ = uVar80;
                auVar71 = vsubps_avx(auVar90,auVar89);
                auVar91._4_4_ = fVar120 * fVar18;
                auVar91._0_4_ = fVar120 * fVar124;
                auVar91._8_4_ = fVar120 * fVar27;
                auVar91._12_4_ = fVar120 * fVar36;
                auVar91._16_4_ = fVar120 * fVar45;
                auVar91._20_4_ = fVar120 * fVar54;
                auVar91._24_4_ = fVar120 * fVar63;
                auVar91._28_4_ = uVar80;
                auVar92._4_4_ = fVar114 * fVar19;
                auVar92._0_4_ = fVar114 * fVar118;
                auVar92._8_4_ = fVar114 * fVar28;
                auVar92._12_4_ = fVar114 * fVar37;
                auVar92._16_4_ = fVar114 * fVar46;
                auVar92._20_4_ = fVar114 * fVar55;
                auVar92._24_4_ = fVar114 * fVar64;
                auVar92._28_4_ = fVar83;
                auVar72 = vsubps_avx(auVar92,auVar91);
                fVar11 = local_1560._0_4_;
                fVar20 = local_1560._4_4_;
                fVar29 = local_1560._8_4_;
                fVar38 = local_1560._12_4_;
                fVar47 = local_1560._16_4_;
                fVar56 = local_1560._20_4_;
                fVar65 = local_1560._24_4_;
                fVar12 = auVar127._0_4_;
                fVar21 = auVar127._4_4_;
                fVar30 = auVar127._8_4_;
                fVar39 = auVar127._12_4_;
                fVar48 = auVar127._16_4_;
                fVar57 = auVar127._20_4_;
                fVar66 = auVar127._24_4_;
                fVar13 = local_1500._0_4_;
                fVar22 = local_1500._4_4_;
                fVar31 = local_1500._8_4_;
                fVar40 = local_1500._12_4_;
                fVar49 = local_1500._16_4_;
                fVar58 = local_1500._20_4_;
                fVar67 = local_1500._24_4_;
                auVar151._0_4_ = fVar120 * fVar13 + fVar114 * fVar12 + fVar119 * fVar11;
                auVar151._4_4_ = fVar120 * fVar22 + fVar114 * fVar21 + fVar119 * fVar20;
                auVar151._8_4_ = fVar120 * fVar31 + fVar114 * fVar30 + fVar119 * fVar29;
                auVar151._12_4_ = fVar120 * fVar40 + fVar114 * fVar39 + fVar119 * fVar38;
                auVar151._16_4_ = fVar120 * fVar49 + fVar114 * fVar48 + fVar119 * fVar47;
                auVar151._20_4_ = fVar120 * fVar58 + fVar114 * fVar57 + fVar119 * fVar56;
                auVar151._24_4_ = fVar120 * fVar67 + fVar114 * fVar66 + fVar119 * fVar65;
                auVar151._28_4_ = fVar119 + fVar119 + fVar83;
                auVar142._8_4_ = 0x80000000;
                auVar142._0_8_ = 0x8000000080000000;
                auVar142._12_4_ = 0x80000000;
                auVar142._16_4_ = 0x80000000;
                auVar142._20_4_ = 0x80000000;
                auVar142._24_4_ = 0x80000000;
                auVar142._28_4_ = 0x80000000;
                auVar127 = vandps_avx(auVar151,auVar142);
                uVar105 = auVar127._0_4_;
                auVar163._0_4_ =
                     (float)(uVar105 ^
                            (uint)(fVar175 * auVar70._0_4_ +
                                  fVar194 * auVar71._0_4_ + fVar203 * auVar72._0_4_));
                uVar182 = auVar127._4_4_;
                auVar163._4_4_ =
                     (float)(uVar182 ^
                            (uint)(fVar181 * auVar70._4_4_ +
                                  fVar197 * auVar71._4_4_ + fVar206 * auVar72._4_4_));
                uVar184 = auVar127._8_4_;
                auVar163._8_4_ =
                     (float)(uVar184 ^
                            (uint)(fVar183 * auVar70._8_4_ +
                                  fVar198 * auVar71._8_4_ + fVar207 * auVar72._8_4_));
                uVar186 = auVar127._12_4_;
                auVar163._12_4_ =
                     (float)(uVar186 ^
                            (uint)(fVar185 * auVar70._12_4_ +
                                  fVar199 * auVar71._12_4_ + fVar208 * auVar72._12_4_));
                uVar188 = auVar127._16_4_;
                auVar163._16_4_ =
                     (float)(uVar188 ^
                            (uint)(fVar187 * auVar70._16_4_ +
                                  fVar200 * auVar71._16_4_ + fVar209 * auVar72._16_4_));
                uVar190 = auVar127._20_4_;
                auVar163._20_4_ =
                     (float)(uVar190 ^
                            (uint)(fVar189 * auVar70._20_4_ +
                                  fVar201 * auVar71._20_4_ + fVar210 * auVar72._20_4_));
                uVar192 = auVar127._24_4_;
                auVar163._24_4_ =
                     (float)(uVar192 ^
                            (uint)(fVar191 * auVar70._24_4_ +
                                  fVar202 * auVar71._24_4_ + fVar211 * auVar72._24_4_));
                uVar193 = auVar127._28_4_;
                auVar163._28_4_ =
                     (float)(uVar193 ^ (uint)(auVar132._28_4_ + auVar10._28_4_ + auVar68._28_4_));
                auVar174._0_4_ =
                     (float)(uVar105 ^
                            (uint)(auVar70._0_4_ * fVar125 +
                                  auVar71._0_4_ * fVar121 + fVar123 * auVar72._0_4_));
                auVar174._4_4_ =
                     (float)(uVar182 ^
                            (uint)(auVar70._4_4_ * fVar16 +
                                  auVar71._4_4_ * fVar14 + fVar15 * auVar72._4_4_));
                auVar174._8_4_ =
                     (float)(uVar184 ^
                            (uint)(auVar70._8_4_ * fVar25 +
                                  auVar71._8_4_ * fVar23 + fVar24 * auVar72._8_4_));
                auVar174._12_4_ =
                     (float)(uVar186 ^
                            (uint)(auVar70._12_4_ * fVar34 +
                                  auVar71._12_4_ * fVar32 + fVar33 * auVar72._12_4_));
                auVar174._16_4_ =
                     (float)(uVar188 ^
                            (uint)(auVar70._16_4_ * fVar43 +
                                  auVar71._16_4_ * fVar41 + fVar42 * auVar72._16_4_));
                auVar174._20_4_ =
                     (float)(uVar190 ^
                            (uint)(auVar70._20_4_ * fVar52 +
                                  auVar71._20_4_ * fVar50 + fVar51 * auVar72._20_4_));
                auVar174._24_4_ =
                     (float)(uVar192 ^
                            (uint)(auVar70._24_4_ * fVar61 +
                                  auVar71._24_4_ * fVar59 + fVar60 * auVar72._24_4_));
                auVar174._28_4_ =
                     (float)(uVar193 ^ (uint)(local_1500._28_4_ + auVar71._28_4_ + auVar72._28_4_));
                auVar132 = ZEXT1232(ZEXT812(0)) << 0x20;
                auVar127 = vcmpps_avx(auVar163,auVar132,5);
                auVar132 = vcmpps_avx(auVar174,auVar132,5);
                auVar127 = vandps_avx(auVar127,auVar132);
                auVar117._8_4_ = 0x7fffffff;
                auVar117._0_8_ = 0x7fffffff7fffffff;
                auVar117._12_4_ = 0x7fffffff;
                auVar117._16_4_ = 0x7fffffff;
                auVar117._20_4_ = 0x7fffffff;
                auVar117._24_4_ = 0x7fffffff;
                auVar117._28_4_ = 0x7fffffff;
                local_1320 = vandps_avx(auVar151,auVar117);
                auVar132 = vcmpps_avx(auVar151,ZEXT1232(ZEXT812(0)) << 0x20,4);
                auVar127 = vandps_avx(auVar127,auVar132);
                auVar143._0_4_ = auVar174._0_4_ + auVar163._0_4_;
                auVar143._4_4_ = auVar174._4_4_ + auVar163._4_4_;
                auVar143._8_4_ = auVar174._8_4_ + auVar163._8_4_;
                auVar143._12_4_ = auVar174._12_4_ + auVar163._12_4_;
                auVar143._16_4_ = auVar174._16_4_ + auVar163._16_4_;
                auVar143._20_4_ = auVar174._20_4_ + auVar163._20_4_;
                auVar143._24_4_ = auVar174._24_4_ + auVar163._24_4_;
                auVar143._28_4_ = auVar174._28_4_ + auVar163._28_4_;
                auVar10 = vcmpps_avx(auVar143,local_1320,2);
                auVar132 = vandps_avx(auVar127,auVar10);
                auVar68 = local_1480 & auVar132;
                if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar68 >> 0x7f,0) != '\0') ||
                      (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar68 >> 0xbf,0) != '\0') ||
                    (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar68[0x1f] < '\0') {
                  auVar132 = vandps_avx(auVar132,local_1480);
                  local_1340._0_4_ =
                       (float)(uVar105 ^
                              (uint)(fVar13 * fVar118 + fVar12 * fVar124 + fVar122 * fVar11));
                  local_1340._4_4_ =
                       (float)(uVar182 ^ (uint)(fVar22 * fVar19 + fVar21 * fVar18 + fVar17 * fVar20)
                              );
                  local_1340._8_4_ =
                       (float)(uVar184 ^ (uint)(fVar31 * fVar28 + fVar30 * fVar27 + fVar26 * fVar29)
                              );
                  local_1340._12_4_ =
                       (float)(uVar186 ^ (uint)(fVar40 * fVar37 + fVar39 * fVar36 + fVar35 * fVar38)
                              );
                  local_1340._16_4_ =
                       (float)(uVar188 ^ (uint)(fVar49 * fVar46 + fVar48 * fVar45 + fVar44 * fVar47)
                              );
                  local_1340._20_4_ =
                       (float)(uVar190 ^ (uint)(fVar58 * fVar55 + fVar57 * fVar54 + fVar53 * fVar56)
                              );
                  local_1340._24_4_ =
                       (float)(uVar192 ^ (uint)(fVar67 * fVar64 + fVar66 * fVar63 + fVar62 * fVar65)
                              );
                  local_1340._28_4_ =
                       uVar193 ^ (uint)(auVar69._28_4_ + auVar10._28_4_ + auVar127._28_4_);
                  fVar114 = (ray->org).field_0.m128[3];
                  fVar119 = local_1320._0_4_;
                  fVar120 = local_1320._4_4_;
                  auVar93._4_4_ = fVar120 * fVar114;
                  auVar93._0_4_ = fVar119 * fVar114;
                  fVar121 = local_1320._8_4_;
                  auVar93._8_4_ = fVar121 * fVar114;
                  fVar123 = local_1320._12_4_;
                  auVar93._12_4_ = fVar123 * fVar114;
                  fVar125 = local_1320._16_4_;
                  auVar93._16_4_ = fVar125 * fVar114;
                  fVar122 = local_1320._20_4_;
                  auVar93._20_4_ = fVar122 * fVar114;
                  fVar124 = local_1320._24_4_;
                  auVar93._24_4_ = fVar124 * fVar114;
                  auVar93._28_4_ = fVar114;
                  auVar127 = vcmpps_avx(auVar93,local_1340,1);
                  fVar114 = ray->tfar;
                  auVar94._4_4_ = fVar120 * fVar114;
                  auVar94._0_4_ = fVar119 * fVar114;
                  auVar94._8_4_ = fVar121 * fVar114;
                  auVar94._12_4_ = fVar123 * fVar114;
                  auVar94._16_4_ = fVar125 * fVar114;
                  auVar94._20_4_ = fVar122 * fVar114;
                  auVar94._24_4_ = fVar124 * fVar114;
                  auVar94._28_4_ = fVar114;
                  auVar10 = vcmpps_avx(local_1340,auVar94,2);
                  auVar127 = vandps_avx(auVar10,auVar127);
                  auVar10 = auVar132 & auVar127;
                  if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar10 >> 0x7f,0) != '\0') ||
                        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar10 >> 0xbf,0) != '\0') ||
                      (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar10[0x1f] < '\0') {
                    auVar4._0_4_ = ray->tfar;
                    auVar4._4_4_ = ray->mask;
                    auVar4._8_4_ = ray->id;
                    auVar4._12_4_ = ray->flags;
                    local_12e0 = vandps_avx(auVar132,auVar127);
                    uVar105 = vextractps_avx(auVar4,1);
                    auVar127 = vsubps_avx(local_1320,auVar174);
                    auVar127 = vblendvps_avx(auVar163,auVar127,local_1440);
                    auVar10 = vsubps_avx(local_1320,auVar163);
                    auVar132 = vblendvps_avx(auVar174,auVar10,local_1440);
                    uStack_1244 = auVar10._28_4_;
                    local_1260[0] = fVar13 * (float)local_1460._0_4_;
                    local_1260[1] = fVar22 * (float)local_1460._4_4_;
                    local_1260[2] = fVar31 * fStack_1458;
                    local_1260[3] = fVar40 * fStack_1454;
                    fStack_1250 = fVar49 * fStack_1450;
                    fStack_124c = fVar58 * fStack_144c;
                    fStack_1248 = fVar67 * fStack_1448;
                    local_1240[0] = fVar12 * (float)local_1460._0_4_;
                    local_1240[1] = fVar21 * (float)local_1460._4_4_;
                    local_1240[2] = fVar30 * fStack_1458;
                    local_1240[3] = fVar39 * fStack_1454;
                    fStack_1230 = fVar48 * fStack_1450;
                    fStack_122c = fVar57 * fStack_144c;
                    fStack_1228 = fVar66 * fStack_1448;
                    uStack_1224 = uStack_1244;
                    local_1220[0] = (float)local_1460._0_4_ * fVar11;
                    local_1220[1] = (float)local_1460._4_4_ * fVar20;
                    local_1220[2] = fStack_1458 * fVar29;
                    local_1220[3] = fStack_1454 * fVar38;
                    fStack_1210 = fStack_1450 * fVar47;
                    fStack_120c = fStack_144c * fVar56;
                    fStack_1208 = fStack_1448 * fVar65;
                    uStack_1204 = uStack_1244;
                    auVar147 = vpshufd_avx(ZEXT416(uVar106),0);
                    auVar147 = vpaddd_avx(auVar147,_DAT_01fab9b0);
                    auVar115 = vpshufd_avx(ZEXT416(uVar107),0);
                    auVar146._0_4_ = (float)(int)(*(ushort *)(local_15d0 + 8 + lVar104) - 1);
                    auVar146._4_12_ = auVar70._4_12_;
                    auVar115 = vpaddd_avx(auVar115,_DAT_01fab9c0);
                    auVar153 = vrcpss_avx(auVar146,auVar146);
                    auVar178._0_4_ = (float)(int)(*(ushort *)(local_15d0 + 10 + lVar104) - 1);
                    auVar178._4_12_ = auVar70._4_12_;
                    auVar137 = vrcpss_avx(auVar178,auVar178);
                    auVar136._16_16_ = auVar147;
                    auVar136._0_16_ = auVar147;
                    auVar10 = vcvtdq2ps_avx(auVar136);
                    auVar147 = ZEXT416((uint)(auVar153._0_4_ *
                                             (2.0 - auVar153._0_4_ * auVar146._0_4_)));
                    auVar147 = vshufps_avx(auVar147,auVar147,0);
                    local_1380 = (fVar119 * auVar10._0_4_ + auVar127._0_4_) * auVar147._0_4_;
                    fStack_137c = (fVar120 * auVar10._4_4_ + auVar127._4_4_) * auVar147._4_4_;
                    fStack_1378 = (fVar121 * auVar10._8_4_ + auVar127._8_4_) * auVar147._8_4_;
                    fStack_1374 = (fVar123 * auVar10._12_4_ + auVar127._12_4_) * auVar147._12_4_;
                    fStack_1370 = (fVar125 * auVar10._16_4_ + auVar127._16_4_) * auVar147._0_4_;
                    fStack_136c = (fVar122 * auVar10._20_4_ + auVar127._20_4_) * auVar147._4_4_;
                    fStack_1368 = (fVar124 * auVar10._24_4_ + auVar127._24_4_) * auVar147._8_4_;
                    fStack_1364 = auVar10._28_4_ + auVar127._28_4_;
                    auVar144._16_16_ = auVar115;
                    auVar144._0_16_ = auVar115;
                    auVar127 = vcvtdq2ps_avx(auVar144);
                    auVar147 = ZEXT416((uint)(auVar137._0_4_ *
                                             (2.0 - auVar137._0_4_ * auVar178._0_4_)));
                    auVar147 = vshufps_avx(auVar147,auVar147,0);
                    local_1360 = (fVar119 * auVar127._0_4_ + auVar132._0_4_) * auVar147._0_4_;
                    fStack_135c = (fVar120 * auVar127._4_4_ + auVar132._4_4_) * auVar147._4_4_;
                    fStack_1358 = (fVar121 * auVar127._8_4_ + auVar132._8_4_) * auVar147._8_4_;
                    fStack_1354 = (fVar123 * auVar127._12_4_ + auVar132._12_4_) * auVar147._12_4_;
                    fStack_1350 = (fVar125 * auVar127._16_4_ + auVar132._16_4_) * auVar147._0_4_;
                    fStack_134c = (fVar122 * auVar127._20_4_ + auVar132._20_4_) * auVar147._4_4_;
                    fStack_1348 = (fVar124 * auVar127._24_4_ + auVar132._24_4_) * auVar147._8_4_;
                    fStack_1344 = auVar127._28_4_ + auVar132._28_4_;
                    if ((local_1660->mask & uVar105) != 0) {
                      pRVar9 = context->args;
                      if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                         (local_1660->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002f2d96:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      local_1540._0_8_ = pRVar9;
                      auVar127 = vrcpps_avx(local_1320);
                      fVar114 = auVar127._0_4_;
                      fVar118 = auVar127._4_4_;
                      auVar95._4_4_ = fVar120 * fVar118;
                      auVar95._0_4_ = fVar119 * fVar114;
                      fVar119 = auVar127._8_4_;
                      auVar95._8_4_ = fVar121 * fVar119;
                      fVar120 = auVar127._12_4_;
                      auVar95._12_4_ = fVar123 * fVar120;
                      fVar121 = auVar127._16_4_;
                      auVar95._16_4_ = fVar125 * fVar121;
                      fVar123 = auVar127._20_4_;
                      auVar95._20_4_ = fVar122 * fVar123;
                      fVar125 = auVar127._24_4_;
                      auVar95._24_4_ = fVar124 * fVar125;
                      auVar95._28_4_ = local_1320._28_4_;
                      auVar164._8_4_ = 0x3f800000;
                      auVar164._0_8_ = 0x3f8000003f800000;
                      auVar164._12_4_ = 0x3f800000;
                      auVar164._16_4_ = 0x3f800000;
                      auVar164._20_4_ = 0x3f800000;
                      auVar164._24_4_ = 0x3f800000;
                      auVar164._28_4_ = 0x3f800000;
                      auVar132 = vsubps_avx(auVar164,auVar95);
                      fVar114 = fVar114 + fVar114 * auVar132._0_4_;
                      fVar118 = fVar118 + fVar118 * auVar132._4_4_;
                      fVar119 = fVar119 + fVar119 * auVar132._8_4_;
                      fVar120 = fVar120 + fVar120 * auVar132._12_4_;
                      fVar121 = fVar121 + fVar121 * auVar132._16_4_;
                      fVar123 = fVar123 + fVar123 * auVar132._20_4_;
                      fVar125 = fVar125 + fVar125 * auVar132._24_4_;
                      local_1280[0] = fVar114 * local_1340._0_4_;
                      local_1280[1] = fVar118 * local_1340._4_4_;
                      local_1280[2] = fVar119 * local_1340._8_4_;
                      local_1280[3] = fVar120 * local_1340._12_4_;
                      fStack_1270 = fVar121 * local_1340._16_4_;
                      fStack_126c = fVar123 * local_1340._20_4_;
                      fStack_1268 = fVar125 * local_1340._24_4_;
                      uStack_1264 = local_1340._28_4_;
                      local_12c0[0] = local_1380 * fVar114;
                      local_12c0[1] = fStack_137c * fVar118;
                      local_12c0[2] = fStack_1378 * fVar119;
                      local_12c0[3] = fStack_1374 * fVar120;
                      fStack_12b0 = fStack_1370 * fVar121;
                      fStack_12ac = fStack_136c * fVar123;
                      fStack_12a8 = fStack_1368 * fVar125;
                      uStack_12a4 = local_1340._28_4_;
                      local_12a0[0] = local_1360 * fVar114;
                      local_12a0[1] = fStack_135c * fVar118;
                      local_12a0[2] = fStack_1358 * fVar119;
                      local_12a0[3] = fStack_1354 * fVar120;
                      fStack_1290 = fStack_1350 * fVar121;
                      fStack_128c = fStack_134c * fVar123;
                      fStack_1288 = fStack_1348 * fVar125;
                      fStack_1284 = auVar127._28_4_ + auVar132._28_4_;
                      iVar96 = vmovmskps_avx(local_12e0);
                      uVar101 = CONCAT44((int)((ulong)pRVar9 >> 0x20),iVar96);
                      uVar99 = 0;
                      if (uVar101 != 0) {
                        for (; (uVar101 >> uVar99 & 1) == 0; uVar99 = uVar99 + 1) {
                        }
                      }
                      local_1520._0_8_ = uVar101;
                      if (iVar96 != 0) {
                        local_1500._0_8_ = context->user;
                        local_1560._0_4_ = ray->tfar;
                        do {
                          local_15b4 = local_12c0[uVar99];
                          local_15b0 = local_12a0[uVar99];
                          ray->tfar = local_1280[uVar99];
                          local_15c0 = local_1260[uVar99];
                          local_15bc = local_1240[uVar99];
                          local_15b8 = local_1220[uVar99];
                          local_15a4 = *(uint *)local_1500._0_8_;
                          local_15a0 = *(uint *)(local_1500._0_8_ + 4);
                          local_1664 = -1;
                          local_1590.valid = &local_1664;
                          local_1590.geometryUserPtr = local_1660->userPtr;
                          local_1590.context = (RTCRayQueryContext *)local_1500._0_8_;
                          local_1590.hit = (RTCHitN *)&local_15c0;
                          local_1590.N = 1;
                          local_15ac = uVar7;
                          local_15a8 = uVar102;
                          local_1590.ray = (RTCRayN *)ray;
                          if ((local_1660->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                             ((*local_1660->occlusionFilterN)(&local_1590), *local_1590.valid != 0))
                          {
                            if ((*(code **)(local_1540._0_8_ + 0x10) == (code *)0x0) ||
                               ((((*(byte *)local_1540._0_8_ & 2) == 0 &&
                                 (((local_1660->field_8).field_0x2 & 0x40) == 0)) ||
                                ((**(code **)(local_1540._0_8_ + 0x10))(&local_1590),
                                *local_1590.valid != 0)))) goto LAB_002f2d96;
                          }
                          ray->tfar = (float)local_1560._0_4_;
                          uVar101 = local_1520._0_8_ ^ 1L << (uVar99 & 0x3f);
                          uVar99 = 0;
                          if (uVar101 != 0) {
                            for (; (uVar101 >> uVar99 & 1) == 0; uVar99 = uVar99 + 1) {
                            }
                          }
                          local_1520._0_8_ = uVar101;
                        } while (uVar101 != 0);
                      }
                    }
                  }
                }
                uVar113 = uVar113 & uVar113 - 1;
              } while (uVar113 != 0);
            }
            local_15e8 = local_15e8 + 1;
            auVar205 = ZEXT3264(local_13a0);
            auVar213 = ZEXT3264(local_13c0);
            auVar215 = ZEXT3264(local_13e0);
            auVar217 = ZEXT3264(local_1400);
            auVar218 = ZEXT3264(local_1420);
          } while (local_15e8 != local_15f0);
        }
        auVar165 = ZEXT3264(_local_14a0);
        auVar152 = ZEXT3264(local_14c0);
        auVar160 = ZEXT3264(local_14e0);
        uVar113 = local_1648;
        uVar99 = local_1630;
        uVar101 = local_1638;
        uVar108 = local_1640;
        uVar109 = local_1658;
        uVar112 = local_1650;
      } while (local_1628 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }